

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews_p.h
# Opt level: O0

Role __thiscall QAccessibleTable::cellRole(QAccessibleTable *this)

{
  Role RVar1;
  QAccessibleTable *this_local;
  Role local_4;
  
  RVar1 = this->m_role;
  if (RVar1 == Table) {
    local_4 = Cell;
  }
  else if (RVar1 == List) {
    local_4 = ListItem;
  }
  else if (RVar1 == Tree) {
    local_4 = TreeItem;
  }
  else {
    local_4 = NoRole;
  }
  return local_4;
}

Assistant:

inline QAccessible::Role cellRole() const {
        switch (m_role) {
        case QAccessible::List:
            return QAccessible::ListItem;
        case QAccessible::Table:
            return QAccessible::Cell;
        case QAccessible::Tree:
            return QAccessible::TreeItem;
        default:
            Q_ASSERT(0);
        }
        return QAccessible::NoRole;
    }